

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O2

bool __thiscall
dxil_spv::emit_sample_grad_instruction(dxil_spv *this,Op opcode,Impl *impl,CallInst *instruction)

{
  int iVar1;
  int iVar2;
  uint32_t image_ops_00;
  bool bVar3;
  bool bVar4;
  ComponentType element_type;
  uint i_2;
  Id IVar5;
  Id IVar6;
  Value *pVVar7;
  Value *value;
  Value *value_00;
  Builder *pBVar8;
  Operation *this_00;
  Operation *this_01;
  mapped_type *pmVar9;
  Operation *pOVar10;
  Type *pTVar11;
  Op OVar12;
  Operation **op;
  pointer ppOVar13;
  uint i;
  uint cols;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  undefined4 in_register_00000034;
  Impl *this_02;
  int iVar18;
  Id IVar19;
  Op op_00;
  undefined1 in_stack_fffffffffffffee8;
  Id local_114;
  uint32_t image_ops;
  ulong local_100;
  ComponentType tmp;
  Builder *local_f0;
  ulong local_e8;
  mapped_type *local_e0;
  uint local_d8;
  Id local_d4;
  uint num_coords;
  uint num_coords_full;
  Value local_c8;
  Value *mult_grad_x [3];
  Id grad_y [3];
  Id grad_x [3];
  Id loaded_id;
  Id image_id;
  Id coord [4];
  Id offsets [3];
  
  this_02 = (Impl *)CONCAT44(in_register_00000034,opcode);
  iVar18 = (int)this;
  if ((iVar18 != 0xfe) &&
     (bVar3 = Converter::Impl::composite_is_accessed(this_02,(Value *)impl), !bVar3)) {
    return true;
  }
  local_f0 = Converter::Impl::builder(this_02);
  pVVar7 = LLVMBC::Instruction::getOperand((Instruction *)impl,1);
  IVar5 = Converter::Impl::get_id_for_value(this_02,pVVar7,0);
  image_id = IVar5;
  pVVar7 = LLVMBC::Instruction::getOperand((Instruction *)impl,2);
  IVar6 = Converter::Impl::get_id_for_value(this_02,pVVar7,0);
  IVar5 = Converter::Impl::build_sampled_image(this_02,IVar5,IVar6,iVar18 == 0xfe);
  local_e0 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this_02->handle_to_resource_meta,&image_id);
  num_coords_full = 0;
  num_coords = 0;
  bVar3 = get_image_dimensions(this_02,image_id,&num_coords_full,&num_coords);
  uVar14 = num_coords_full;
  if (!bVar3) {
    return bVar3;
  }
  image_ops = 4;
  coord[0] = 0;
  coord[1] = 0;
  coord[2] = 0;
  coord[3] = 0;
  uVar16 = (ulong)num_coords_full;
  local_d4 = IVar5;
  for (uVar15 = 0; uVar16 != uVar15; uVar15 = uVar15 + 1) {
    pVVar7 = LLVMBC::Instruction::getOperand((Instruction *)impl,(int)uVar15 + 3);
    IVar5 = Converter::Impl::get_id_for_value(this_02,pVVar7,0);
    coord[uVar15] = IVar5;
  }
  offsets[2] = 0;
  offsets[0] = 0;
  offsets[1] = 0;
  uVar15 = (ulong)num_coords;
  get_texel_offsets(this_02,(CallInst *)impl,&image_ops,7,num_coords,offsets,
                    (bool)in_stack_fffffffffffffee8);
  local_e8 = (ulong)(iVar18 == 0xfe | 10);
  local_114 = 0;
  local_100 = uVar15;
  if ((this_02->current_block != (Vector<Operation_*> *)0x0) &&
     (local_114 = 0, (this_02->options).grad_opt.enabled == true)) {
    mult_grad_x[0] = (Value *)0x0;
    mult_grad_x[1] = (Value *)0x0;
    mult_grad_x[2] = (Value *)0x0;
    local_c8.type = (Type *)0x0;
    local_c8.kind = Argument;
    local_c8._12_4_ = 0;
    local_c8.tween_id = 0;
    uVar16 = 0;
    while( true ) {
      uVar15 = local_100;
      if (uVar16 == local_100) {
        pVVar7 = mult_grad_x[0];
        uVar17 = 0;
        pTVar11 = local_c8.type;
        goto LAB_0015fb11;
      }
      iVar1 = (int)uVar16;
      pVVar7 = LLVMBC::Instruction::getOperand((Instruction *)impl,iVar1 + 3);
      bVar4 = LLVMBC::isa<LLVMBC::Constant>(pVVar7);
      if (bVar4) goto LAB_0015fcfc;
      iVar2 = (int)local_e8;
      value = LLVMBC::Instruction::getOperand((Instruction *)impl,iVar2 + iVar1);
      value_00 = LLVMBC::Instruction::getOperand((Instruction *)impl,iVar2 + iVar1 + 3);
      local_114 = 0;
      IVar5 = Converter::Impl::get_id_for_value(this_02,value,0);
      IVar6 = Converter::Impl::get_id_for_value(this_02,value_00,0);
      uVar15 = local_100;
      if ((IVar5 == 0) || (IVar6 == 0)) break;
      for (ppOVar13 = (this_02->current_block->
                      super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          ppOVar13 !=
          (this_02->current_block->
          super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
          )._M_impl.super__Vector_impl_data._M_finish; ppOVar13 = ppOVar13 + 1) {
        IVar19 = 0;
        if ((*ppOVar13)->id != IVar5) {
          IVar19 = IVar5;
        }
        IVar5 = 0;
        if ((*ppOVar13)->id != IVar6) {
          IVar5 = IVar6;
        }
        IVar6 = IVar5;
        IVar5 = IVar19;
      }
      if ((IVar5 != 0 || IVar6 != 0) ||
         (bVar4 = binary_op_is_multiple_of_derivative
                            (value,pVVar7,DerivCoarseX,DerivFineX,mult_grad_x + uVar16),
         uVar15 = local_100, !bVar4)) break;
      bVar4 = binary_op_is_multiple_of_derivative
                        (value_00,pVVar7,DerivCoarseY,DerivFineY,(Value **)(&local_c8.type + uVar16)
                        );
      uVar16 = uVar16 + 1;
      uVar15 = local_100;
      if (!bVar4) break;
    }
  }
  goto LAB_0015fd0d;
LAB_0015fb11:
  if ((uint)local_100 == uVar17) goto LAB_0015fb55;
  if (mult_grad_x[uVar17] == (Value *)0x0) goto LAB_0015fcfc;
  local_114 = 0;
  if (((Value *)(&local_c8.type)[uVar17] == (Value *)0x0) ||
     ((uVar17 != 0 &&
      ((mult_grad_x[uVar17] != mult_grad_x[0] ||
       ((Value *)(&local_c8.type)[uVar17] != (Value *)local_c8.type)))))) goto LAB_0015fd0d;
  uVar17 = uVar17 + 1;
  goto LAB_0015fb11;
LAB_0015fb55:
  if ((mult_grad_x[0] == (Value *)local_c8.type) ||
     ((this_02->options).grad_opt.assume_uniform_scale == true)) {
    pBVar8 = Converter::Impl::builder(this_02);
    if (this_02->glsl_std450_ext == 0) {
      IVar5 = spv::Builder::import(pBVar8,"GLSL.std.450");
      this_02->glsl_std450_ext = IVar5;
    }
    IVar5 = spv::Builder::makeFloatType(pBVar8,0x20);
    this_00 = Converter::Impl::allocate(this_02,OpExtInst,IVar5);
    Operation::add_id(this_00,this_02->glsl_std450_ext);
    Operation::add_literal(this_00,4);
    IVar6 = Converter::Impl::get_id_for_value(this_02,pVVar7,0);
    Operation::add_id(this_00,IVar6);
    Converter::Impl::add(this_02,this_00,false);
    pOVar10 = this_00;
    if (pVVar7 != (Value *)pTVar11) {
      this_01 = Converter::Impl::allocate(this_02,OpExtInst,IVar5);
      Operation::add_id(this_01,this_02->glsl_std450_ext);
      Operation::add_literal(this_01,4);
      IVar6 = Converter::Impl::get_id_for_value(this_02,(Value *)pTVar11,0);
      Operation::add_id(this_01,IVar6);
      Converter::Impl::add(this_02,this_01,false);
      pOVar10 = Converter::Impl::allocate(this_02,OpExtInst,IVar5);
      Operation::add_id(pOVar10,this_02->glsl_std450_ext);
      Operation::add_literal(pOVar10,0x25);
      Operation::add_id(pOVar10,this_00->id);
      Operation::add_id(pOVar10,this_01->id);
      Converter::Impl::add(this_02,pOVar10,false);
    }
    IVar6 = pOVar10->id;
    pOVar10 = Converter::Impl::allocate(this_02,OpExtInst,IVar5);
    Operation::add_id(pOVar10,this_02->glsl_std450_ext);
    Operation::add_literal(pOVar10,0x1e);
    Operation::add_id(pOVar10,IVar6);
    Converter::Impl::add(this_02,pOVar10,false);
    local_114 = pOVar10->id;
    uVar15 = local_100;
  }
  else {
LAB_0015fcfc:
    local_114 = 0;
  }
LAB_0015fd0d:
  grad_x[2] = 0;
  grad_x[0] = 0;
  grad_x[1] = 0;
  grad_y[2] = 0;
  grad_y[0] = 0;
  grad_y[1] = 0;
  if (local_114 == 0) {
    iVar1 = (Id)local_e8;
    for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
      pVVar7 = LLVMBC::Instruction::getOperand((Instruction *)impl,iVar1 + (int)uVar16);
      IVar5 = Converter::Impl::get_id_for_value(this_02,pVVar7,0);
      grad_x[uVar16] = IVar5;
    }
    for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
      pVVar7 = LLVMBC::Instruction::getOperand((Instruction *)impl,iVar1 + 3 + (int)uVar16);
      IVar5 = Converter::Impl::get_id_for_value(this_02,pVVar7,0);
      grad_y[uVar16] = IVar5;
    }
  }
  else {
    image_ops = 1;
  }
  uVar17 = iVar18 == 0xfe | 0x10;
  pVVar7 = LLVMBC::Instruction::getOperand((Instruction *)impl,uVar17);
  bVar4 = LLVMBC::isa<LLVMBC::UndefValue>(pVVar7);
  IVar5 = 0;
  if (!bVar4) {
    pVVar7 = LLVMBC::Instruction::getOperand((Instruction *)impl,uVar17);
    IVar5 = Converter::Impl::get_id_for_value(this_02,pVVar7,0);
    image_ops = image_ops | 0x80;
    spv::Builder::addCapability(local_f0,CapabilityMinLod);
  }
  mult_grad_x[0] = (Value *)impl;
  pmVar9 = std::__detail::
           _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this_02->llvm_composite_meta,mult_grad_x);
  uVar17 = pmVar9->access_mask;
  if ((uVar17 & 0x10) != 0) {
    spv::Builder::addCapability(local_f0,CapabilitySparseResidency);
  }
  element_type = Converter::Impl::get_effective_typed_resource_type(local_e0->component_type);
  cols = (uint)(iVar18 != 0xfe) * 3 + 1;
  IVar6 = Converter::Impl::get_type_id(this_02,element_type,1,cols,false);
  local_e8 = CONCAT44(local_e8._4_4_,IVar5);
  if ((uVar17 & 0x10) != 0) {
    IVar5 = spv::Builder::makeUintType(local_f0,0x20);
    local_c8.type._4_4_ = IVar6;
    local_c8.type._0_4_ = IVar5;
    mult_grad_x[0] = (Value *)0x0;
    mult_grad_x[1] = (Value *)0x0;
    mult_grad_x[2] = (Value *)0x0;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_range_initialize<unsigned_int_const*>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)mult_grad_x,
               &local_c8);
    IVar6 = Converter::Impl::get_struct_type(this_02,(Vector<spv::Id> *)mult_grad_x,0,"SparseTexel")
    ;
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
               mult_grad_x);
  }
  local_d8 = cols;
  if (iVar18 == 0xfe) {
    bVar4 = (uVar17 & 0x10) == 0;
    OVar12 = OpImageSparseSampleDrefImplicitLod;
    if (bVar4) {
      OVar12 = OpImageSampleDrefImplicitLod;
    }
    op_00 = OpImageSparseSampleDrefExplicitLod;
    if (bVar4) {
      op_00 = OpImageSampleDrefExplicitLod;
    }
    if (local_114 != 0) {
      op_00 = OVar12;
    }
    pVVar7 = LLVMBC::Instruction::getOperand((Instruction *)impl,10);
    IVar5 = Converter::Impl::get_id_for_value(this_02,pVVar7,0);
  }
  else {
    if (local_114 == 0) {
      OVar12 = OpImageSampleExplicitLod;
      op_00 = OpImageSparseSampleExplicitLod;
    }
    else {
      OVar12 = OpImageSampleImplicitLod;
      op_00 = OpImageSparseSampleImplicitLod;
    }
    if ((uVar17 & 0x10) == 0) {
      op_00 = OVar12;
    }
    IVar5 = 0;
  }
  pOVar10 = Converter::Impl::allocate(this_02,op_00,(Value *)impl,IVar6);
  if ((uVar17 & 0x10) == 0) {
    pTVar11 = LLVMBC::Value::getType((Value *)impl);
    pTVar11 = LLVMBC::Type::getStructElementType(pTVar11,0);
    Converter::Impl::decorate_relaxed_precision(this_02,pTVar11,pOVar10->id,true);
  }
  Operation::add_id(pOVar10,local_d4);
  IVar6 = spv::Builder::makeFloatType(local_f0,0x20);
  IVar6 = Converter::Impl::build_vector(this_02,IVar6,coord,uVar14);
  Operation::add_id(pOVar10,IVar6);
  if (IVar5 != 0) {
    Operation::add_id(pOVar10,IVar5);
  }
  image_ops_00 = image_ops;
  Operation::add_literal(pOVar10,image_ops);
  pBVar8 = local_f0;
  if ((image_ops_00 & 4) == 0) {
    uVar14 = (uint)local_100;
    if ((image_ops_00 & 1) == 0) goto LAB_00160054;
  }
  else {
    IVar5 = spv::Builder::makeFloatType(local_f0,0x20);
    uVar14 = (uint)local_100;
    IVar5 = Converter::Impl::build_vector(this_02,IVar5,grad_x,uVar14);
    Operation::add_id(pOVar10,IVar5);
    IVar5 = spv::Builder::makeFloatType(pBVar8,0x20);
    local_114 = Converter::Impl::build_vector(this_02,IVar5,grad_y,uVar14);
  }
  Operation::add_id(pOVar10,local_114);
LAB_00160054:
  if ((image_ops_00 & 0x18) != 0) {
    IVar5 = build_texel_offset_vector(this_02,offsets,uVar14,image_ops_00,false);
    Operation::add_id(pOVar10,IVar5);
  }
  if ((char)image_ops_00 < '\0') {
    Operation::add_id(pOVar10,(Id)local_e8);
  }
  Converter::Impl::add(this_02,pOVar10,false);
  pTVar11 = LLVMBC::Value::getType((Value *)impl);
  pTVar11 = LLVMBC::Type::getStructElementType(pTVar11,0);
  if ((uVar17 & 0x10) == 0) {
    if (iVar18 == 0xfe) {
      loaded_id = pOVar10->id;
      tmp = local_e0->component_type;
      Converter::Impl::fixup_load_type_typed(this_02,&tmp,1,&loaded_id,pTVar11);
      IVar5 = Converter::Impl::get_type_id(this_02,pTVar11,0);
      IVar5 = spv::Builder::makeVectorType(local_f0,IVar5,4);
      pOVar10 = Converter::Impl::allocate(this_02,OpCompositeConstruct,IVar5);
      local_c8.type._4_4_ = loaded_id;
      local_c8.type._0_4_ = loaded_id;
      local_c8.kind = loaded_id;
      local_c8._12_4_ = loaded_id;
      mult_grad_x[1] = (Value *)0x4;
      mult_grad_x[0] = &local_c8;
      Operation::add_ids(pOVar10,(initializer_list<unsigned_int> *)mult_grad_x);
      Converter::Impl::add(this_02,pOVar10,false);
      Converter::Impl::rewrite_value(this_02,(Value *)impl,pOVar10->id);
    }
    else {
      Converter::Impl::fixup_load_type_typed
                (this_02,local_e0->component_type,4,(Value *)impl,pTVar11);
      build_exploded_composite_from_vector(this_02,(Instruction *)impl,4);
    }
  }
  else {
    Converter::Impl::repack_sparse_feedback
              (this_02,local_e0->component_type,local_d8,(Value *)impl,pTVar11,0);
  }
  return bVar3;
}

Assistant:

bool emit_sample_grad_instruction(DXIL::Op opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	bool comparison_sampling = opcode == DXIL::Op::SampleCmpGrad;

	// Elide dead loads.
	if (!comparison_sampling && !impl.composite_is_accessed(instruction))
		return true;

	auto &builder = impl.builder();
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id sampler_id = impl.get_id_for_value(instruction->getOperand(2));
	spv::Id combined_image_sampler_id = impl.build_sampled_image(image_id, sampler_id, comparison_sampling);
	const auto &meta = impl.handle_to_resource_meta[image_id];

	unsigned num_coords_full = 0, num_coords = 0;
	if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
		return false;

	uint32_t image_ops = spv::ImageOperandsGradMask;

	spv::Id coord[4] = {};
	for (unsigned i = 0; i < num_coords_full; i++)
		coord[i] = impl.get_id_for_value(instruction->getOperand(i + 3));

	spv::Id offsets[3] = {};
	if (!get_texel_offsets(impl, instruction, image_ops, 7, num_coords, offsets, false))
		return false;

	unsigned grad_argument_index = comparison_sampling ? 11 : 10;
	spv::Id bias_id = sample_grad_is_lod_bias(impl, instruction, num_coords, grad_argument_index);

	spv::Id grad_x[3] = {};
	spv::Id grad_y[3] = {};

	if (bias_id)
	{
		image_ops = spv::ImageOperandsBiasMask;
	}
	else
	{
		for (unsigned i = 0; i < num_coords; i++)
			grad_x[i] = impl.get_id_for_value(instruction->getOperand(i + grad_argument_index));
		for (unsigned i = 0; i < num_coords; i++)
			grad_y[i] = impl.get_id_for_value(instruction->getOperand(i + grad_argument_index + 3));
	}

	unsigned min_lod_argument_index = comparison_sampling ? 17 : 16;
	spv::Id aux_argument = 0;
	if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(min_lod_argument_index)))
	{
		aux_argument = impl.get_id_for_value(instruction->getOperand(min_lod_argument_index));
		image_ops |= spv::ImageOperandsMinLodMask;
		builder.addCapability(spv::CapabilityMinLod);
	}

	auto &access_meta = impl.llvm_composite_meta[instruction];
	bool sparse = (access_meta.access_mask & (1u << 4)) != 0;
	if (sparse)
		builder.addCapability(spv::CapabilitySparseResidency);

	auto effective_component_type = Converter::Impl::get_effective_typed_resource_type(meta.component_type);
	spv::Id texel_type = impl.get_type_id(effective_component_type, 1, comparison_sampling ? 1 : 4);
	spv::Id sample_type;

	if (sparse)
		sample_type = impl.get_struct_type({ builder.makeUintType(32), texel_type }, 0, "SparseTexel");
	else
		sample_type = texel_type;

	spv::Id dref_id = 0;
	spv::Op spv_op;
	if (comparison_sampling)
	{
		if (bias_id)
			spv_op = sparse ? spv::OpImageSparseSampleDrefImplicitLod : spv::OpImageSampleDrefImplicitLod;
		else
			spv_op = sparse ? spv::OpImageSparseSampleDrefExplicitLod : spv::OpImageSampleDrefExplicitLod;

		dref_id = impl.get_id_for_value(instruction->getOperand(10));
	}
	else
	{
		if (bias_id)
			spv_op = sparse ? spv::OpImageSparseSampleImplicitLod : spv::OpImageSampleImplicitLod;
		else
			spv_op = sparse ? spv::OpImageSparseSampleExplicitLod : spv::OpImageSampleExplicitLod;
	}

	Operation *op = impl.allocate(spv_op, instruction, sample_type);

	if (!sparse)
		impl.decorate_relaxed_precision(instruction->getType()->getStructElementType(0), op->id, true);

	op->add_id(combined_image_sampler_id);
	op->add_id(impl.build_vector(builder.makeFloatType(32), coord, num_coords_full));

	if (dref_id)
		op->add_id(dref_id);

	op->add_literal(image_ops);

	if (image_ops & spv::ImageOperandsGradMask)
	{
		op->add_id(impl.build_vector(builder.makeFloatType(32), grad_x, num_coords));
		op->add_id(impl.build_vector(builder.makeFloatType(32), grad_y, num_coords));
	}
	else if (image_ops & spv::ImageOperandsBiasMask)
		op->add_id(bias_id);

	if (image_ops & (spv::ImageOperandsConstOffsetMask | spv::ImageOperandsOffsetMask))
		op->add_id(build_texel_offset_vector(impl, offsets, num_coords, image_ops, false));

	if (image_ops & spv::ImageOperandsMinLodMask)
		op->add_id(aux_argument);

	impl.add(op);

	auto *target_type = instruction->getType()->getStructElementType(0);

	if (sparse)
		impl.repack_sparse_feedback(meta.component_type, comparison_sampling ? 1 : 4, instruction, target_type);
	else if (comparison_sampling)
	{
		spv::Id loaded_id = op->id;
		auto tmp = meta.component_type;
		impl.fixup_load_type_typed(tmp, 1, loaded_id, target_type);
		Operation *splat_op =
			impl.allocate(spv::OpCompositeConstruct, builder.makeVectorType(impl.get_type_id(target_type), 4));
		splat_op->add_ids({ loaded_id, loaded_id, loaded_id, loaded_id });
		impl.add(splat_op);
		impl.rewrite_value(instruction, splat_op->id);
	}
	else
	{
		impl.fixup_load_type_typed(meta.component_type, 4, instruction, target_type);
		build_exploded_composite_from_vector(impl, instruction, 4);
	}
	return true;
}